

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O1

event_queue_t * __thiscall
so_5::disp::active_obj::impl::
dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
::create_thread_for_agent
          (dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
           *this,agent_t *agent)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  anon_class_24_3_f9d96878 main_action;
  work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>
  *pwVar3;
  int iVar4;
  exception_t *peVar5;
  _Base_ptr p_Var6;
  _Rb_tree_header *p_Var7;
  lock_factory_t lock_factory;
  shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
  thread;
  undefined1 local_71;
  undefined8 in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>
  *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
  *local_40;
  agent_t *paStack_38;
  work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>
  **local_30;
  
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->m_lock);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  if (this->m_shutdown_started != true) {
    p_Var1 = &(this->m_agent_threads)._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = (this->m_agent_threads)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var6 = &p_Var1->_M_header;
    for (; (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
        p_Var2 = (&p_Var2->_M_left)[*(agent_t **)(p_Var2 + 1) < agent]) {
      if (*(agent_t **)(p_Var2 + 1) >= agent) {
        p_Var6 = p_Var2;
      }
    }
    p_Var7 = p_Var1;
    if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
       (p_Var7 = (_Rb_tree_header *)p_Var6,
       agent < (agent_t *)((_Rb_tree_header *)p_Var6)->_M_node_count)) {
      p_Var7 = p_Var1;
    }
    if (p_Var1 == p_Var7) {
      std::
      function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>_()>
      ::function((function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>_()>
                  *)&stack0xffffffffffffff90,&(this->m_params).m_queue_params.m_lock_factory);
      local_50 = (work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>
                  *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>,std::allocator<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>>,std::function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>>()>>
                (&local_48,
                 (work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>
                  **)&local_50,
                 (allocator<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
                  *)&local_71,
                 (function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>_()>
                  *)&stack0xffffffffffffff90);
      reuse::work_thread::details::
      work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>::
      start(local_50);
      main_action.agent = (agent_t *)in_stack_ffffffffffffff98;
      main_action.this =
           (dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
            *)in_stack_ffffffffffffff90;
      main_action.thread =
           (shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
            *)in_stack_ffffffffffffffa0;
      local_40 = this;
      paStack_38 = agent;
      local_30 = &local_50;
      details::
      do_with_rollback_on_exception<so_5::disp::active_obj::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>>::create_thread_for_agent(so_5::agent_t_const&)::_lambda()_1_,so_5::disp::active_obj::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>>::create_thread_for_agent(so_5::agent_t_const&)::_lambda()_2_>
                (main_action,(anon_class_8_1_6d04ff48)agent);
      pwVar3 = local_50;
      if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
      }
      if ((shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
           *)in_stack_ffffffffffffffa0 !=
          (shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
           *)0x0) {
        (*(code *)in_stack_ffffffffffffffa0)(&stack0xffffffffffffff90,&stack0xffffffffffffff90,3);
      }
      pthread_mutex_unlock((pthread_mutex_t *)&this->m_lock);
      return (event_queue_t *)(pwVar3 + 0x10);
    }
    peVar5 = (exception_t *)__cxa_allocate_exception(0x18);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xffffffffffffff90,"thread for the agent is already exists","");
    exception_t::exception_t(peVar5,(string *)&stack0xffffffffffffff90,0x1f);
    __cxa_throw(peVar5,&exception_t::typeinfo,exception_t::~exception_t);
  }
  peVar5 = (exception_t *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xffffffffffffff90,"shutdown was initiated","");
  exception_t::exception_t(peVar5,(string *)&stack0xffffffffffffff90,0x1f);
  __cxa_throw(peVar5,&exception_t::typeinfo,exception_t::~exception_t);
}

Assistant:

virtual event_queue_t *
		create_thread_for_agent( const agent_t & agent ) override
			{
				std::lock_guard< std::mutex > lock( m_lock );

				if( m_shutdown_started )
					throw so_5::exception_t(
						"shutdown was initiated",
						rc_disp_create_failed );

				if( m_agent_threads.end() != m_agent_threads.find( &agent ) )
					throw so_5::exception_t(
						"thread for the agent is already exists",
						rc_disp_create_failed );

				auto lock_factory = m_params.queue_params().lock_factory();
				auto thread = std::make_shared< WORK_THREAD >(
						std::move(lock_factory) );

				thread->start();
				so_5::details::do_with_rollback_on_exception(
						[&] { m_agent_threads[ &agent ] = thread; },
						[&thread] { shutdown_and_wait( *thread ); } );

				return thread->get_agent_binding();
			}